

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

string * gmlc::utilities::base64_decode_to_string_abi_cxx11_
                   (string_view encoded_string,size_t offset)

{
  byte bVar1;
  value_type vVar2;
  uchar uVar3;
  value_type vVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  const_reference pvVar8;
  value_type *pvVar9;
  reference pvVar10;
  byte *pbVar11;
  reference pvVar12;
  int in_ECX;
  string *in_RDI;
  bool bVar13;
  int j_1;
  int j;
  array<unsigned_char,_4UL> char_array_4;
  array<unsigned_char,_3UL> char_array_3;
  int indexIn;
  int indexOut;
  size_type in_len;
  string *ret;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 uVar15;
  char in_stack_fffffffffffffeef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  bool local_69;
  int local_54;
  int local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_38.field_2._8_4_ = in_ECX;
  local_38.field_2._M_allocated_capacity =
       CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
  local_38._M_string_length._4_4_ = 0;
  local_38._M_string_length._0_4_ = local_38.field_2._8_4_;
  local_38._M_dataplus._M_p._6_1_ = 0;
  local_38._M_dataplus._M_p._4_2_ = 0;
  local_38._M_dataplus._M_p._0_4_ = 0;
  std::__cxx11::string::string(in_stack_fffffffffffffef0);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_stack_ffffffffffffff00,CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)
            );
  while( true ) {
    sVar7 = local_38.field_2._M_allocated_capacity - 1;
    bVar13 = local_38.field_2._M_allocated_capacity != 0;
    local_69 = false;
    local_38.field_2._M_allocated_capacity = sVar7;
    if (bVar13) {
      pvVar8 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&local_18,(long)(int)local_38._M_string_length);
      local_69 = false;
      if (*pvVar8 != '=') {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                  (&local_18,(long)(int)local_38._M_string_length);
        local_69 = isBase64('\0');
      }
    }
    if (local_69 == false) break;
    pvVar9 = (value_type *)
             CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (&local_18,(long)(int)local_38._M_string_length);
    vVar4 = *pvVar9;
    local_38._M_string_length._4_4_ = local_38._M_string_length._4_4_ + 1;
    pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pvVar10 = vVar4;
    local_38._M_string_length._0_4_ = (int)local_38._M_string_length + 1;
    if (local_38._M_string_length._4_4_ == 4) {
      std::array<unsigned_char,_4UL>::operator[]
                ((array<unsigned_char,_4UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      uVar3 = CharMapper<unsigned_char>::operator[]
                        ((CharMapper<unsigned_char> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
      pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar10 = uVar3;
      std::array<unsigned_char,_4UL>::operator[]
                ((array<unsigned_char,_4UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      uVar3 = CharMapper<unsigned_char>::operator[]
                        ((CharMapper<unsigned_char> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
      pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar10 = uVar3;
      std::array<unsigned_char,_4UL>::operator[]
                ((array<unsigned_char,_4UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      uVar3 = CharMapper<unsigned_char>::operator[]
                        ((CharMapper<unsigned_char> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
      pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar10 = uVar3;
      std::array<unsigned_char,_4UL>::operator[]
                ((array<unsigned_char,_4UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      uVar3 = CharMapper<unsigned_char>::operator[]
                        ((CharMapper<unsigned_char> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
      pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar10 = uVar3;
      pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      vVar4 = *pvVar10;
      pbVar11 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      bVar1 = *pbVar11;
      pvVar12 = std::array<unsigned_char,_3UL>::operator[]
                          ((array<unsigned_char,_3UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar12 = (char)((bVar1 & 0x30) >> 4) + vVar4 * '\x04';
      pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      vVar4 = *pvVar10;
      pbVar11 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      bVar1 = *pbVar11;
      pbVar11 = std::array<unsigned_char,_3UL>::operator[]
                          ((array<unsigned_char,_3UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pbVar11 = vVar4 << 4 | (byte)((bVar1 & 0x3c) >> 2);
      pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      vVar4 = *pvVar10;
      pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      vVar2 = *pvVar10;
      pvVar12 = std::array<unsigned_char,_3UL>::operator[]
                          ((array<unsigned_char,_3UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar12 = vVar4 * '@' + vVar2;
      std::array<unsigned_char,_3UL>::operator[]
                ((array<unsigned_char,_3UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_stack_fffffffffffffef0,in_stack_fffffffffffffeef);
      std::array<unsigned_char,_3UL>::operator[]
                ((array<unsigned_char,_3UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_stack_fffffffffffffef0,in_stack_fffffffffffffeef);
      std::array<unsigned_char,_3UL>::operator[]
                ((array<unsigned_char,_3UL> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_stack_fffffffffffffef0,in_stack_fffffffffffffeef);
      local_38._M_string_length._4_4_ = 0;
    }
  }
  if (0 < local_38._M_string_length._4_4_) {
    for (local_50 = local_38._M_string_length._4_4_; local_50 < 4; local_50 = local_50 + 1) {
      pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      *pvVar10 = '\0';
    }
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    uVar3 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
    pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pvVar10 = uVar3;
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    uVar3 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
    pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pvVar10 = uVar3;
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    uVar3 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
    this = &local_38;
    pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pvVar10 = uVar3;
    std::array<unsigned_char,_4UL>::operator[]
              ((array<unsigned_char,_4UL> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    uVar3 = CharMapper<unsigned_char>::operator[]
                      ((CharMapper<unsigned_char> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (uchar)((uint)in_stack_fffffffffffffedc >> 0x18));
    pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pvVar10 = uVar3;
    pbVar11 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    iVar5 = (uint)*pbVar11 << 2;
    pbVar11 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(in_stack_fffffffffffffedc,iVar5));
    uVar14 = CONCAT13((char)iVar5 + (char)((*pbVar11 & 0x30) >> 4),(int3)in_stack_fffffffffffffedc);
    pvVar12 = std::array<unsigned_char,_3UL>::operator[]
                        ((array<unsigned_char,_3UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(uVar14,iVar5));
    *pvVar12 = (value_type)((uint)uVar14 >> 0x18);
    pbVar11 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         CONCAT44(uVar14,iVar5));
    iVar6 = (*pbVar11 & 0xf) << 4;
    pbVar11 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)CONCAT44(in_stack_fffffffffffffee4,iVar6),
                         CONCAT44(uVar14,iVar5));
    uVar15 = CONCAT13((char)iVar6 + (char)((*pbVar11 & 0x3c) >> 2),(int3)in_stack_fffffffffffffee4);
    pvVar12 = std::array<unsigned_char,_3UL>::operator[]
                        ((array<unsigned_char,_3UL> *)CONCAT44(uVar15,iVar6),CONCAT44(uVar14,iVar5))
    ;
    *pvVar12 = (value_type)((uint)uVar15 >> 0x18);
    pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)CONCAT44(uVar15,iVar6),CONCAT44(uVar14,iVar5))
    ;
    vVar4 = *pvVar10;
    pvVar10 = std::array<unsigned_char,_4UL>::operator[]
                        ((array<unsigned_char,_4UL> *)CONCAT44(uVar15,iVar6),CONCAT44(uVar14,iVar5))
    ;
    vVar4 = vVar4 * '@' + *pvVar10;
    pvVar12 = std::array<unsigned_char,_3UL>::operator[]
                        ((array<unsigned_char,_3UL> *)CONCAT44(uVar15,iVar6),CONCAT44(uVar14,iVar5))
    ;
    *pvVar12 = vVar4;
    for (local_54 = 0; local_54 < local_38._M_string_length._4_4_ + -1; local_54 = local_54 + 1) {
      std::array<unsigned_char,_3UL>::operator[]
                ((array<unsigned_char,_3UL> *)CONCAT44(uVar15,iVar6),CONCAT44(uVar14,iVar5));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(this,vVar4);
    }
  }
  return in_RDI;
}

Assistant:

std::string
    base64_decode_to_string(std::string_view encoded_string, size_t offset)
{
    auto in_len = encoded_string.size();
    int indexOut{0};
    int indexIn{static_cast<int>(offset)};
    std::array<unsigned char, 3> char_array_3{{0U, 0U, 0U}};
    std::array<unsigned char, 4> char_array_4{{0U, 0U, 0U, 0U}};
    std::string ret;
    ret.reserve(in_len);

    while (((in_len--) != 0U) && (encoded_string[indexIn] != '=') &&
           isBase64(encoded_string[indexIn])) {
        char_array_4[indexOut++] = encoded_string[indexIn];
        indexIn++;
        if (indexOut == 4) {
            char_array_4[0] = b64Map[char_array_4[0]];
            char_array_4[1] = b64Map[char_array_4[1]];
            char_array_4[2] = b64Map[char_array_4[2]];
            char_array_4[3] = b64Map[char_array_4[3]];

            char_array_3[0] =
                (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
            char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
                ((char_array_4[2] & 0x3cU) >> 2U);
            char_array_3[2] =
                ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

            ret.push_back(char_array_3[0]);
            ret.push_back(char_array_3[1]);
            ret.push_back(char_array_3[2]);

            indexOut = 0;
        }
    }

    if (indexOut > 0) {
        for (int j = indexOut; j < 4; j++) {
            char_array_4[j] = 0;
        }
        char_array_4[0] = b64Map[char_array_4[0]];
        char_array_4[1] = b64Map[char_array_4[1]];
        char_array_4[2] = b64Map[char_array_4[2]];
        char_array_4[3] = b64Map[char_array_4[3]];

        char_array_3[0] =
            (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
        char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
            ((char_array_4[2] & 0x3cU) >> 2U);
        char_array_3[2] = ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

        for (int j = 0; (j < indexOut - 1); j++) {
            ret.push_back(char_array_3[j]);
        }
    }

    return ret;
}